

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerSyncHotJournal(Pager *pPager)

{
  int local_14;
  int rc;
  Pager *pPager_local;
  
  local_14 = 0;
  if (pPager->noSync == '\0') {
    local_14 = sqlite3OsSync(pPager->jfd,2);
  }
  if (local_14 == 0) {
    local_14 = sqlite3OsFileSize(pPager->jfd,&pPager->journalHdr);
  }
  return local_14;
}

Assistant:

static int pagerSyncHotJournal(Pager *pPager){
  int rc = SQLITE_OK;
  if( !pPager->noSync ){
    rc = sqlite3OsSync(pPager->jfd, SQLITE_SYNC_NORMAL);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3OsFileSize(pPager->jfd, &pPager->journalHdr);
  }
  return rc;
}